

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_local_value.hpp
# Opt level: O1

void __thiscall
ylt::metric::thread_local_value<long>::~thread_local_value(thread_local_value<long> *this)

{
  pointer paVar1;
  __pointer_type paVar2;
  vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
  *__range3;
  atomic<std::atomic<long>_*> *t;
  pointer paVar3;
  
  paVar1 = (this->duplicates_).
           super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (paVar3 = (this->duplicates_).
                super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; paVar3 != paVar1; paVar3 = paVar3 + 1) {
    if (((paVar3->_M_b)._M_p != (__pointer_type)0x0) &&
       (paVar2 = (paVar3->_M_b)._M_p, paVar2 != (__pointer_type)0x0)) {
      operator_delete(paVar2,8);
    }
  }
  paVar3 = (this->duplicates_).
           super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3,(long)(this->duplicates_).
                                 super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar3);
    return;
  }
  return;
}

Assistant:

~thread_local_value() {
    for (auto &t : duplicates_) {
      if (t) {
        delete t.load();
      }
    }
  }